

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_rewriter.cpp
# Opt level: O3

void __thiscall
duckdb::SumRewriterOptimizer::StandardVisitOperator(SumRewriterOptimizer *this,LogicalOperator *op)

{
  pointer puVar1;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *child;
  pointer op_00;
  
  puVar1 = (op->children).
           super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (op_00 = (op->children).
               super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start; op_00 != puVar1; op_00 = op_00 + 1) {
    Optimize(this,op_00);
  }
  if ((this->aggregate_map)._M_h._M_element_count != 0) {
    LogicalOperatorVisitor::VisitOperatorExpressions(&this->super_LogicalOperatorVisitor,op);
    return;
  }
  return;
}

Assistant:

void SumRewriterOptimizer::StandardVisitOperator(LogicalOperator &op) {
	for (auto &child : op.children) {
		Optimize(child);
	}
	if (!aggregate_map.empty()) {
		VisitOperatorExpressions(op);
	}
}